

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slot_Machine.cpp
# Opt level: O0

int main(void)

{
  undefined1 local_30 [8];
  SelectGame selectgame;
  double credits;
  
  selectgame._credits = 0.0;
  SelectGame::SelectGame((SelectGame *)local_30);
  SelectGame::selectGame_Welcome((SelectGame *)local_30);
  SelectGame::selectGame_Games((SelectGame *)local_30);
  SelectGame::selectGame_Option((SelectGame *)local_30,&selectgame._credits);
  SelectGame::~SelectGame((SelectGame *)local_30);
  return 0;
}

Assistant:

int main()
{
    double credits = 0;
    //select Game
    SelectGame selectgame;
    selectgame.selectGame_Welcome();
    selectgame.selectGame_Games();
    //choosing a game
    selectgame.selectGame_Option(credits);
}